

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

plain_range_sorted<CSkins::CSkin>
partition_binary<plain_range_sorted<CSkins::CSkin>,CSkins::CSkin>
          (plain_range_sorted<CSkins::CSkin> range,CSkin value)

{
  uint uVar1;
  int iVar2;
  CSkin *pCVar3;
  CSkin *pCVar4;
  uint uVar5;
  plain_range_sorted<CSkins::CSkin> pVar6;
  
  pCVar3 = range.super_plain_range<CSkins::CSkin>.end;
  pCVar4 = range.super_plain_range<CSkins::CSkin>.begin;
  if (pCVar4 < pCVar3) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x97,1,"empty");
    iVar2 = str_comp_nocase(pCVar3[-1].m_aName,value.m_aName);
    if (iVar2 < 0) {
      pCVar4 = (CSkin *)0x0;
      pCVar3 = (CSkin *)0x0;
    }
    else {
      iVar2 = (int)((ulong)((long)pCVar3 - (long)pCVar4) >> 3);
      while (uVar1 = iVar2 * -0x3d70a3d7, 1 < uVar1) {
        uVar5 = uVar1 - 1 >> 1;
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                       ,0x98,(uint)(uVar5 < uVar1),"out of range");
        iVar2 = str_comp_nocase(pCVar4[uVar5].m_aName,value.m_aName);
        pCVar3 = pCVar4 + (uVar5 + 1);
        if (iVar2 < 0) {
          pCVar4 = pCVar3;
        }
        pCVar3 = pCVar3 + (iVar2 >> 0x1f & uVar1 - 1);
        iVar2 = (int)((ulong)((long)pCVar3 - (long)pCVar4) >> 3);
      }
    }
  }
  pVar6.super_plain_range<CSkins::CSkin>.end = pCVar3;
  pVar6.super_plain_range<CSkins::CSkin>.begin = pCVar4;
  return (plain_range_sorted<CSkins::CSkin>)pVar6.super_plain_range<CSkins::CSkin>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}